

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  value_type local_9;
  
  ImVector<char>::clear(&this->Buf);
  local_9 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_9);
  return;
}

Assistant:

void                clear() { Buf.clear(); Buf.push_back(0); }